

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::ArrayInputStream::BackUp(ArrayInputStream *this,int count)

{
  int iVar1;
  string *psVar2;
  LogMessage aLStack_18 [16];
  
  iVar1 = this->last_returned_size_;
  if ((long)iVar1 < 1) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar1,0,"last_returned_size_ > 0");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x3e,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_18,(char (*) [55])"BackUp() can only be called after a successful Next().");
  }
  else {
    if (iVar1 < count) {
      BackUp();
    }
    else if (-1 < count) {
      this->position_ = this->position_ - count;
      this->last_returned_size_ = 0;
      return;
    }
    BackUp();
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_18)
  ;
}

Assistant:

void ArrayInputStream::BackUp(int count) {
  ABSL_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  ABSL_CHECK_LE(count, last_returned_size_);
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}